

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

IterateResult __thiscall gl3cts::ReservedNamesTest::iterate(ReservedNamesTest *this)

{
  _shader_type shader_type;
  _language_feature language_feature;
  pointer pcVar1;
  undefined1 auVar2 [8];
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  ContextType ctxType;
  int iVar6;
  deUint32 dVar7;
  GLuint GVar8;
  undefined4 extraout_var;
  size_t sVar10;
  undefined1 auVar11 [8];
  undefined1 auVar12 [8];
  char *pcVar13;
  pointer pbVar14;
  undefined8 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  undefined1 auVar17 [8];
  GLint compile_status;
  char *so_body_string_raw;
  string current_invalid_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_names;
  string so_body_string;
  int local_284;
  char *local_280;
  undefined1 local_278 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  char *local_230;
  undefined8 local_228;
  char local_220;
  undefined7 uStack_21f;
  string local_210;
  string local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  undefined1 local_1b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  long lVar9;
  
  local_284 = 1;
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x124);
  if (bVar4) {
    (**(code **)(lVar9 + 0x868))(0x92d5,&this->m_max_gs_acs);
    (**(code **)(lVar9 + 0x868))(0x92d3,&this->m_max_tc_acs);
    (**(code **)(lVar9 + 0x868))(0x92d4,&this->m_max_te_acs);
    (**(code **)(lVar9 + 0x868))(0x92d2,&this->m_max_vs_acs);
  }
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar4) {
    (**(code **)(lVar9 + 0x868))(0x90da,&this->m_max_fs_ssbos);
    (**(code **)(lVar9 + 0x868))(0x90d7,&this->m_max_gs_ssbos);
    (**(code **)(lVar9 + 0x868))(0x90d8,&this->m_max_tc_ssbos);
    (**(code **)(lVar9 + 0x868))(0x90d9,&this->m_max_te_ssbos);
    (**(code **)(lVar9 + 0x868))(0x90d6,&this->m_max_vs_ssbos);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glGetIntegerv() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x1507);
  }
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar4) {
    GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8e88);
    this->m_so_ids[3] = GVar8;
    GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8e87);
    this->m_so_ids[4] = GVar8;
  }
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x134);
  if (bVar4) {
    GVar8 = (**(code **)(lVar9 + 0x3f0))(0x91b9);
    this->m_so_ids[0] = GVar8;
  }
  GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  this->m_so_ids[1] = GVar8;
  GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8dd9);
  this->m_so_ids[2] = GVar8;
  GVar8 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  this->m_so_ids[5] = GVar8;
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x151a);
  getReservedNames_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_278,this);
  local_1a8[0]._0_8_ =
       local_258.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  paStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  local_1b8 = (undefined1  [8])
              local_258.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_278._16_8_;
  local_278._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_278._8_8_ = (pointer)0x0;
  local_278._16_8_ = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_278);
  getSupportedShaderTypes
            ((vector<gl3cts::ReservedNamesTest::_shader_type,_std::allocator<gl3cts::ReservedNamesTest::_shader_type>_>
              *)local_1b8,this);
  uVar3 = local_1a8[0]._M_allocated_capacity;
  auVar2 = local_1b8;
  local_1d0 = paStack_1b0;
  if (local_1b8 == (undefined1  [8])paStack_1b0) {
    bVar4 = true;
    uVar15 = (pointer)0x0;
    auVar17 = (undefined1  [8])0x0;
  }
  else {
    bVar4 = true;
    auVar11 = local_1b8;
    pbVar14 = (pointer)0x0;
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    do {
      shader_type = *(_shader_type *)auVar11;
      uVar15 = pbVar14;
      auVar17 = (undefined1  [8])paVar16;
      local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)auVar11;
      if (this->m_so_ids[shader_type] != 0) {
        getSupportedLanguageFeatures
                  ((vector<gl3cts::ReservedNamesTest::_language_feature,_std::allocator<gl3cts::ReservedNamesTest::_language_feature>_>
                    *)local_1b8,this,shader_type);
        uVar15 = local_1a8[0]._M_allocated_capacity;
        auVar17 = local_1b8;
        local_238 = paStack_1b0;
        local_1b8 = (undefined1  [8])0x0;
        paStack_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x0;
        local_1a8[0]._M_allocated_capacity = (pointer)0x0;
        if (paVar16 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(paVar16,(long)pbVar14 - (long)paVar16);
        }
        auVar11 = local_1b8;
        if (local_1b8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_1b8,local_1a8[0]._M_allocated_capacity - (long)local_1b8);
        }
        auVar12 = auVar17;
        if (auVar17 != (undefined1  [8])local_238) {
          do {
            language_feature = *(_language_feature *)auVar12;
            local_1c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)auVar12;
            bVar5 = isStructAllowed((ReservedNamesTest *)auVar11,shader_type,language_feature);
            for (pbVar14 = local_258.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pbVar14 !=
                local_258.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
              local_278._0_8_ = local_278 + 0x10;
              pcVar1 = (pbVar14->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_278,pcVar1,pcVar1 + pbVar14->_M_string_length);
              local_230 = &local_220;
              local_228 = 0;
              local_220 = '\0';
              local_280 = (char *)0x0;
              if ((!bVar5) || (iVar6 = std::__cxx11::string::compare(local_278), iVar6 != 0)) {
                getShaderBody_abi_cxx11_
                          ((string *)local_1b8,this,shader_type,language_feature,
                           (char *)local_278._0_8_);
                std::__cxx11::string::operator=((string *)&local_230,(string *)local_1b8);
                if (local_1b8 != (undefined1  [8])local_1a8) {
                  operator_delete((void *)local_1b8,(ulong)(local_1a8[0]._M_allocated_capacity + 1))
                  ;
                }
                local_280 = local_230;
                (**(code **)(lVar9 + 0x12b8))(this->m_so_ids[shader_type],1,&local_280,0);
                dVar7 = (**(code **)(lVar9 + 0x800))();
                glu::checkError(dVar7,"glShaderSource() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x154c);
                (**(code **)(lVar9 + 0x248))(this->m_so_ids[shader_type]);
                dVar7 = (**(code **)(lVar9 + 0x800))();
                glu::checkError(dVar7,"glCompileShader() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x154f);
                (**(code **)(lVar9 + 0xa70))(this->m_so_ids[shader_type],0x8b81,&local_284);
                dVar7 = (**(code **)(lVar9 + 0x800))();
                glu::checkError(dVar7,"glGetShaderiv() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x1552);
                if (local_284 != 0) {
                  local_1b8 = (undefined1  [8])
                              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                              m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&paStack_1b0);
                  pcVar13 = "A ";
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_1b0,"A ",2)
                  ;
                  getLanguageFeatureName_abi_cxx11_
                            (&local_1f0,(ReservedNamesTest *)pcVar13,language_feature);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0,local_1f0._M_dataplus._M_p,
                             local_1f0._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0," named [",8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0,(char *)local_278._0_8_,local_278._8_8_);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&paStack_1b0,"]",1);
                  pcVar13 = ", defined in ";
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0,", defined in ",0xd);
                  getShaderTypeName_abi_cxx11_(&local_210,(ReservedNamesTest *)pcVar13,shader_type);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0,local_210._M_dataplus._M_p,
                             local_210._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0,
                             ", was accepted by the compiler, which is prohibited by the spec. Offending source code:\n>>\n"
                             ,0x5b);
                  pcVar13 = local_280;
                  if (local_280 == (char *)0x0) {
                    std::ios::clear((int)(ostringstream *)&paStack_1b0 +
                                    (int)*(undefined8 *)((long)paStack_1b0 + -0x18));
                  }
                  else {
                    sVar10 = strlen(local_280);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&paStack_1b0,pcVar13,sVar10);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&paStack_1b0,"\n<<\n\n",5);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._M_dataplus._M_p != &local_210.field_2) {
                    operator_delete(local_210._M_dataplus._M_p,
                                    local_210.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                    operator_delete(local_1f0._M_dataplus._M_p,
                                    local_1f0.field_2._M_allocated_capacity + 1);
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&paStack_1b0);
                  std::ios_base::~ios_base(local_140);
                  bVar4 = false;
                }
              }
              if (local_230 != &local_220) {
                operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
              }
              auVar11 = (undefined1  [8])local_278._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_278 + 0x10)) {
                operator_delete((void *)local_278._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_278._16_8_)->_M_p + 1));
              }
            }
            auVar12 = (undefined1  [8])((long)local_1c0 + 4);
          } while (auVar12 != (undefined1  [8])local_238);
        }
      }
      auVar11 = (undefined1  [8])((long)local_1c8 + 4);
      pbVar14 = (pointer)uVar15;
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)auVar17;
    } while (auVar11 != (undefined1  [8])local_1d0);
  }
  pcVar13 = "Fail";
  if (bVar4) {
    pcVar13 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar4 & QP_TEST_RESULT_FAIL,pcVar13);
  if (auVar2 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar2,uVar3 - (long)auVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  if (auVar17 != (undefined1  [8])0x0) {
    operator_delete((void *)auVar17,uVar15 - (long)auVar17);
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ReservedNamesTest::iterate()
{
	glw::GLint					   compile_status = GL_TRUE;
	glu::ContextType			   context_type   = m_context.getRenderContext().getType();
	const glw::Functions&		   gl			  = m_context.getRenderContext().getFunctions();
	std::vector<_language_feature> language_features;
	std::vector<std::string>	   reserved_names;
	bool						   result = true;
	std::vector<_shader_type>	  shader_types;

	/* Retrieve important GL constant values */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 2)))
	{
		gl.getIntegerv(GL_MAX_GEOMETRY_ATOMIC_COUNTERS, &m_max_gs_acs);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_ATOMIC_COUNTERS, &m_max_tc_acs);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_ATOMIC_COUNTERS, &m_max_te_acs);
		gl.getIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_max_vs_acs);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		gl.getIntegerv(GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS, &m_max_fs_ssbos);
		gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &m_max_gs_ssbos);
		gl.getIntegerv(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, &m_max_tc_ssbos);
		gl.getIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &m_max_te_ssbos);
		gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &m_max_vs_ssbos);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed.");
	}

	/* Create the shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_so_ids[SHADER_TYPE_TESS_CONTROL]	= gl.createShader(GL_TESS_CONTROL_SHADER);
		m_so_ids[SHADER_TYPE_TESS_EVALUATION] = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 3)))
	{
		m_so_ids[SHADER_TYPE_COMPUTE] = gl.createShader(GL_COMPUTE_SHADER);
	}

	m_so_ids[SHADER_TYPE_FRAGMENT] = gl.createShader(GL_FRAGMENT_SHADER);
	m_so_ids[SHADER_TYPE_GEOMETRY] = gl.createShader(GL_GEOMETRY_SHADER);
	m_so_ids[SHADER_TYPE_VERTEX]   = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Retrieve context version-specific data */
	reserved_names = getReservedNames();
	shader_types   = getSupportedShaderTypes();

	/* Iterate over all supported shader stages.. */
	for (std::vector<_shader_type>::const_iterator shader_type_it = shader_types.begin();
		 shader_type_it != shader_types.end(); ++shader_type_it)
	{
		_shader_type current_shader_type = *shader_type_it;

		if (m_so_ids[current_shader_type] == 0)
		{
			/* Skip stages not supported by the currently running context version. */
			continue;
		}

		language_features = getSupportedLanguageFeatures(current_shader_type);

		/* ..and all language features we can test for the running context */
		for (std::vector<_language_feature>::const_iterator language_feature_it = language_features.begin();
			 language_feature_it != language_features.end(); ++language_feature_it)
		{
			_language_feature current_language_feature = *language_feature_it;

			bool structAllowed = isStructAllowed(current_shader_type, current_language_feature);

			/* Finally, all the reserved names we need to test - loop over them at this point */
			for (std::vector<std::string>::const_iterator reserved_name_it = reserved_names.begin();
				 reserved_name_it != reserved_names.end(); ++reserved_name_it)
			{
				std::string current_invalid_name = *reserved_name_it;
				std::string so_body_string;
				const char* so_body_string_raw = NULL;

				// There are certain shader types that allow struct for in/out declarations
				if (structAllowed && current_invalid_name.compare("struct") == 0)
				{
					continue;
				}

				/* Form the shader body */
				so_body_string =
					getShaderBody(current_shader_type, current_language_feature, current_invalid_name.c_str());
				so_body_string_raw = so_body_string.c_str();

				/* Try to compile the shader */
				gl.shaderSource(m_so_ids[current_shader_type], 1, /* count */
								&so_body_string_raw, NULL);		  /* length */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

				gl.compileShader(m_so_ids[current_shader_type]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

				gl.getShaderiv(m_so_ids[current_shader_type], GL_COMPILE_STATUS, &compile_status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

/* Left for the debugging purposes for those in need .. */
#if 0
				char temp[4096];

				gl.getShaderInfoLog(m_so_ids[current_shader_type],
					4096,
					NULL,
					temp);

				m_testCtx.getLog() << tcu::TestLog::Message
					<< "\n"
					"-----------------------------\n"
					"Shader:\n"
					">>\n"
					<< so_body_string_raw
					<< "\n<<\n"
					"\n"
					"Info log:\n"
					">>\n"
					<< temp
					<< "\n<<\n\n"
					<< tcu::TestLog::EndMessage;
#endif

				if (compile_status != GL_FALSE)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "A "
									   << getLanguageFeatureName(current_language_feature) << " named ["
									   << current_invalid_name << "]"
									   << ", defined in " << getShaderTypeName(current_shader_type)
									   << ", was accepted by the compiler, "
										  "which is prohibited by the spec. Offending source code:\n"
										  ">>\n"
									   << so_body_string_raw << "\n<<\n\n"
									   << tcu::TestLog::EndMessage;

					result = false;
				}

			} /* for (all reserved names for the current context) */
		}	 /* for (all language features supported by the context) */
	}		  /* for (all shader types supported by the context) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}